

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O0

bool __thiscall
duckdb::
QuantileCompare<duckdb::MadAccessor<duckdb::timestamp_t,_duckdb::interval_t,_duckdb::timestamp_t>_>
::operator()(QuantileCompare<duckdb::MadAccessor<duckdb::timestamp_t,_duckdb::interval_t,_duckdb::timestamp_t>_>
             *this,INPUT_TYPE *lhs,INPUT_TYPE *rhs)

{
  bool bVar1;
  interval_t *in_RDI;
  RESULT_TYPE rval;
  RESULT_TYPE lval;
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbf;
  
  MadAccessor<duckdb::timestamp_t,_duckdb::interval_t,_duckdb::timestamp_t>::operator()
            ((MadAccessor<duckdb::timestamp_t,_duckdb::interval_t,_duckdb::timestamp_t> *)in_RDI,
             (INPUT_TYPE *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
  MadAccessor<duckdb::timestamp_t,_duckdb::interval_t,_duckdb::timestamp_t>::operator()
            ((MadAccessor<duckdb::timestamp_t,_duckdb::interval_t,_duckdb::timestamp_t> *)in_RDI,
             (INPUT_TYPE *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
  if ((in_RDI[1].months & 1) == 0) {
    bVar1 = interval_t::operator<
                      (in_RDI,(interval_t *)
                              CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
  }
  else {
    bVar1 = interval_t::operator<
                      (in_RDI,(interval_t *)
                              CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
  }
  return bVar1;
}

Assistant:

inline bool operator()(const INPUT_TYPE &lhs, const INPUT_TYPE &rhs) const {
		const auto lval = accessor_l(lhs);
		const auto rval = accessor_r(rhs);

		return desc ? (rval < lval) : (lval < rval);
	}